

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# char_conversions.h
# Opt level: O1

uint mjs::unicode::utf32_to_utf8<char>(char32_t code_point,char *out)

{
  uint uVar1;
  byte bVar2;
  
  bVar2 = (byte)code_point;
  if ((uint)code_point < 0x80) {
    *out = bVar2;
    return 1;
  }
  if ((uint)code_point < 0x800) {
    *out = (byte)((uint)code_point >> 6) | 0xc0;
    out[1] = bVar2 & 0x3f | 0x80;
    return 2;
  }
  if ((uint)code_point < 0x10000) {
    *out = (byte)((uint)code_point >> 0xc) | 0xe0;
    out[1] = (byte)((uint)code_point >> 6) & 0x3f | 0x80;
    out[2] = bVar2 & 0x3f | 0x80;
    return 3;
  }
  uVar1 = 0;
  if ((uint)code_point < 0x110000) {
    *out = (byte)((uint)code_point >> 0x12) | 0xf0;
    out[1] = (byte)((uint)code_point >> 0xc) & 0x3f | 0x80;
    out[2] = (byte)((uint)code_point >> 6) & 0x3f | 0x80;
    out[3] = bVar2 & 0x3f | 0x80;
    uVar1 = 4;
  }
  return uVar1;
}

Assistant:

unsigned utf32_to_utf8(char32_t code_point, CharT* out) {
    if (code_point < 0x80) {
        out[0] = static_cast<CharT>(static_cast<uint8_t>(code_point));
        return 1;
    } else if (code_point < 0x800) {
        out[0] = static_cast<CharT>(static_cast<uint8_t>(0b11000000 | (code_point >> 6)));
        out[1] = static_cast<CharT>(static_cast<uint8_t>(0b10000000 | (code_point & 0x3f)));
        return 2;
    } else if (code_point < 0x10000) {
        out[0] = static_cast<CharT>(static_cast<uint8_t>(0b11100000 | (code_point >> 12)));
        out[1] = static_cast<CharT>(static_cast<uint8_t>(0b10000000 | ((code_point >> 6) & 0x3f)));
        out[2] = static_cast<CharT>(static_cast<uint8_t>(0b10000000 | (code_point & 0x3f)));
        return 3;
    } else if (code_point < max_code_point) {
        out[0] = static_cast<CharT>(static_cast<uint8_t>(0b11110000 | (code_point >> 18)));
        out[1] = static_cast<CharT>(static_cast<uint8_t>(0b10000000 | ((code_point >> 12) & 0x3f)));
        out[2] = static_cast<CharT>(static_cast<uint8_t>(0b10000000 | ((code_point >> 6) & 0x3f)));
        out[3] = static_cast<CharT>(static_cast<uint8_t>(0b10000000 | (code_point & 0x3f)));
        return 4;
    }
    return 0;
}